

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

ssize_t correct_reed_solomon_decode
                  (correct_reed_solomon *rs,uint8_t *encoded,size_t encoded_length,uint8_t *msg)

{
  byte *pbVar1;
  field_logarithm_t **ppfVar2;
  field_element_t *pfVar3;
  size_t __n;
  field_element_t *pfVar4;
  bool bVar5;
  field_t fVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  field_element_t fVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint i;
  uint uVar15;
  long lVar16;
  polynomial_t poly;
  polynomial_t poly_log;
  uint in_stack_ffffffffffffff78;
  
  uVar12 = rs->block_length;
  uVar11 = 0xffffffffffffffff;
  if (encoded_length <= uVar12) {
    uVar11 = encoded_length - rs->min_distance;
    if (rs->has_init_decode == false) {
      correct_reed_solomon_decoder_create(rs);
    }
    if (encoded_length != 0) {
      uVar10 = 1;
      uVar13 = 0;
      do {
        uVar14 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        (rs->received_polynomial).coeff[uVar13] = encoded[encoded_length - uVar14];
        uVar13 = uVar14;
      } while (uVar14 <= encoded_length && encoded_length - uVar14 != 0);
    }
    if (uVar12 != encoded_length) {
      uVar10 = 1;
      uVar13 = 0;
      do {
        (rs->received_polynomial).coeff[encoded_length + uVar13] = '\0';
        uVar13 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar13 < uVar12 - encoded_length);
    }
    ppfVar2 = rs->generator_root_exp;
    pfVar3 = rs->syndromes;
    __n = rs->min_distance;
    fVar6 = rs->field;
    uVar7 = (rs->received_polynomial).coeff;
    uVar8 = (rs->received_polynomial).order;
    poly.order = uVar8;
    poly.coeff = (field_element_t *)uVar7;
    memset(pfVar3,0,__n);
    if (__n != 0) {
      bVar5 = true;
      uVar10 = 1;
      uVar12 = 0;
      do {
        poly._12_4_ = 0;
        fVar9 = polynomial_eval_lut(fVar6,poly,ppfVar2[uVar12]);
        if (fVar9 != '\0') {
          bVar5 = false;
        }
        pfVar3[uVar12] = fVar9;
        uVar12 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar12 < __n);
      if (!bVar5) {
        uVar15 = 0;
        uVar10 = reed_solomon_find_error_locator(rs,0);
        (rs->error_locator).order = uVar10;
        do {
          (rs->error_locator_log).coeff[uVar15] = (rs->field).log[(rs->error_locator).coeff[uVar15]]
          ;
          uVar15 = uVar15 + 1;
          uVar10 = (rs->error_locator).order;
        } while (uVar15 <= uVar10);
        (rs->error_locator_log).order = uVar10;
        pfVar3 = rs->error_roots;
        ppfVar2 = rs->element_exp;
        fVar6 = rs->field;
        pfVar4 = (rs->error_locator_log).coeff;
        lVar16 = 0;
        memset(pfVar3,0,(ulong)uVar10);
        uVar12 = 0;
        do {
          poly_log.order = uVar10;
          poly_log.coeff = pfVar4;
          poly_log._12_4_ = 0;
          fVar9 = polynomial_eval_log_lut(fVar6,poly_log,ppfVar2[lVar16]);
          if (fVar9 == '\0') {
            pfVar3[uVar12] = (field_element_t)lVar16;
            uVar12 = (ulong)((int)uVar12 + 1);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x100);
        if ((uint)uVar12 != uVar10) {
          return -1;
        }
        reed_solomon_find_error_locations
                  (rs->field,rs->generator_root_gap,rs->error_roots,rs->error_locations,
                   (rs->error_locator).order,in_stack_ffffffffffffff78);
        reed_solomon_find_error_values(rs);
        if ((rs->error_locator).order != 0) {
          uVar12 = 0;
          do {
            pbVar1 = (rs->received_polynomial).coeff + rs->error_locations[uVar12];
            *pbVar1 = *pbVar1 ^ rs->error_vals[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar12 < (rs->error_locator).order);
        }
        if (uVar11 == 0) {
          return 0;
        }
        uVar10 = 1;
        uVar12 = 0;
        do {
          uVar13 = (ulong)uVar10;
          msg[uVar12] = (rs->received_polynomial).coeff[encoded_length - uVar13];
          uVar10 = uVar10 + 1;
          uVar12 = uVar13;
        } while (uVar13 < uVar11);
        return uVar11;
      }
    }
    if (uVar11 != 0) {
      uVar10 = 1;
      uVar12 = 0;
      do {
        uVar13 = (ulong)uVar10;
        msg[uVar12] = (rs->received_polynomial).coeff[encoded_length - uVar13];
        uVar10 = uVar10 + 1;
        uVar12 = uVar13;
      } while (uVar13 < uVar11);
    }
  }
  return uVar11;
}

Assistant:

ssize_t correct_reed_solomon_decode(correct_reed_solomon *rs, const uint8_t *encoded, size_t encoded_length,
                                    uint8_t *msg) {
    if (encoded_length > rs->block_length) {
        return -1;
    }

    // the message is the non-remainder part
    size_t msg_length = encoded_length - rs->min_distance;
    // if they handed us a nonfull block, we'll write in 0s
    size_t pad_length = rs->block_length - encoded_length;

    if (!rs->has_init_decode) {
        // initialize rs for decoding
        correct_reed_solomon_decoder_create(rs);
    }

    // we need to copy to our local buffer
    // the buffer we're given has the coordinates in the wrong direction
    // e.g. byte 0 corresponds to the 254th order coefficient
    // so we're going to flip and then write padding
    // the final copied buffer will look like
    // | rem (rs->min_distance) | msg (msg_length) | pad (pad_length) |

    for (unsigned int i = 0; i < encoded_length; i++) {
        rs->received_polynomial.coeff[i] = encoded[encoded_length - (i + 1)];
    }

    // fill the pad_length with 0s
    for (unsigned int i = 0; i < pad_length; i++) {
        rs->received_polynomial.coeff[i + encoded_length] = 0;
    }


    bool all_zero = reed_solomon_find_syndromes(rs->field, rs->received_polynomial, rs->generator_root_exp,
                                                rs->syndromes, rs->min_distance);

    if (all_zero) {
        // syndromes were all zero, so there was no error in the message
        // copy to msg and we are done
        for (unsigned int i = 0; i < msg_length; i++) {
            msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
        }
        return msg_length;
    }

    unsigned int order = reed_solomon_find_error_locator(rs, 0);
    // XXX fix this vvvv
    rs->error_locator.order = order;

    for (unsigned int i = 0; i <= rs->error_locator.order; i++) {
        // this is a little strange since the coeffs are logs, not elements
        // also, we'll be storing log(0) = 0 for any 0 coeffs in the error locator
        // that would seem bad but we'll just be using this in chien search, and we'll skip all 0 coeffs
        // (you might point out that log(1) also = 0, which would seem to alias. however, that's ok,
        //   because log(1) = 255 as well, and in fact that's how it's represented in our log table)
        rs->error_locator_log.coeff[i] = rs->field.log[rs->error_locator.coeff[i]];
    }
    rs->error_locator_log.order = rs->error_locator.order;

    if (!reed_solomon_factorize_error_locator(rs->field, 0, rs->error_locator_log, rs->error_roots, rs->element_exp)) {
        // roots couldn't be found, so there were too many errors to deal with
        // RS has failed for this message
        return -1;
    }

    reed_solomon_find_error_locations(rs->field, rs->generator_root_gap, rs->error_roots, rs->error_locations,
                                      rs->error_locator.order, 0);

    reed_solomon_find_error_values(rs);

    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        rs->received_polynomial.coeff[rs->error_locations[i]] =
            field_sub(rs->field, rs->received_polynomial.coeff[rs->error_locations[i]], rs->error_vals[i]);
    }

    for (unsigned int i = 0; i < msg_length; i++) {
        msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
    }

    return msg_length;
}